

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Vec_IntLits2Vars(Vec_Int_t *p,int Shift)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  
  if (0 < p->nSize) {
    piVar2 = p->pArray;
    lVar3 = 0;
    do {
      uVar1 = piVar2[lVar3];
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      piVar2[lVar3] = (uVar1 >> 1) + Shift;
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nSize);
  }
  return;
}

Assistant:

static inline void Vec_IntLits2Vars( Vec_Int_t * p, int Shift )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Abc_Lit2Var( p->pArray[i] ) + Shift;
}